

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_multiplier.h
# Opt level: O0

Scale * icu_63::number::impl::scaleFromProperties
                  (Scale *__return_storage_ptr__,DecimalFormatProperties *properties)

{
  int iVar1;
  int power;
  int32_t arbitraryMultiplier;
  int32_t magnitudeMultiplier;
  DecimalFormatProperties *properties_local;
  
  power = properties->magnitudeMultiplier + properties->multiplierScale;
  iVar1 = properties->multiplier;
  if ((power == 0) || (iVar1 == 1)) {
    if (power == 0) {
      if (iVar1 == 1) {
        Scale::none();
      }
      else {
        Scale::byDouble(__return_storage_ptr__,(double)iVar1);
      }
    }
    else {
      Scale::powerOfTen(__return_storage_ptr__,power);
    }
  }
  else {
    Scale::byDoubleAndPowerOfTen(__return_storage_ptr__,(double)iVar1,power);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline Scale scaleFromProperties(const DecimalFormatProperties& properties) {
    int32_t magnitudeMultiplier = properties.magnitudeMultiplier + properties.multiplierScale;
    int32_t arbitraryMultiplier = properties.multiplier;
    if (magnitudeMultiplier != 0 && arbitraryMultiplier != 1) {
        return Scale::byDoubleAndPowerOfTen(arbitraryMultiplier, magnitudeMultiplier);
    } else if (magnitudeMultiplier != 0) {
        return Scale::powerOfTen(magnitudeMultiplier);
    } else if (arbitraryMultiplier != 1) {
        return Scale::byDouble(arbitraryMultiplier);
    } else {
        return Scale::none();
    }
}